

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags)

{
  mz_uint64 mVar1;
  mz_uint64 cur_file_ofs;
  mz_bool mVar2;
  mz_uint flags;
  tdefl_status tVar3;
  size_t sVar4;
  FILE *__stream;
  void *uncomp_size_00;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  mz_uint8 *ptr;
  ulong uVar8;
  mz_ulong mVar9;
  tdefl_compressor *d;
  tdefl_flush flush;
  void *local_130;
  void *local_120;
  tdefl_status status;
  size_t in_buf_size;
  tdefl_compressor *pComp;
  mz_zip_writer_add_state state;
  mz_bool result;
  mz_uint n;
  void *pRead_buf;
  mz_uint64 uncomp_remaining;
  FILE *pSrc_file;
  mz_uint8 local_dir_header [30];
  size_t archive_name_size;
  mz_uint64 comp_size;
  mz_uint64 uncomp_size;
  mz_uint64 cur_archive_file_ofs;
  mz_uint64 local_dir_header_ofs;
  mz_uint16 local_70;
  mz_uint16 local_6e;
  mz_uint16 ext_attributes;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint16 method;
  mz_uint num_alignment_padding_bytes;
  mz_uint level;
  mz_uint uncomp_crc32;
  mz_uint level_and_flags_local;
  mz_uint16 comment_size_local;
  void *pComment_local;
  char *pSrc_filename_local;
  char *pArchive_name_local;
  mz_zip_archive *pZip_local;
  
  num_alignment_padding_bytes = 0;
  local_6e = 0;
  local_70 = 0;
  local_dir_header_ofs._6_2_ = 0;
  local_dir_header_ofs._4_2_ = 0;
  mVar1 = pZip->m_archive_size;
  cur_file_ofs = pZip->m_archive_size;
  archive_name_size = 0;
  level = level_and_flags;
  if ((int)level_and_flags < 0) {
    level = 6;
  }
  _dos_time = level & 0xf;
  if (((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
       (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) || (pArchive_name == (char *)0x0)) ||
     (((comment_size != 0 && (pComment == (void *)0x0)) || (10 < _dos_time)))) {
    pZip_local._4_4_ = 0;
  }
  else if ((level & 0x400) == 0) {
    uncomp_crc32._2_2_ = comment_size;
    _level_and_flags_local = pComment;
    pComment_local = pSrc_filename;
    pSrc_filename_local = pArchive_name;
    pArchive_name_local = (char *)pZip;
    mVar2 = (anonymous_namespace)::miniz::mz_zip_writer_validate_archive_name(pArchive_name);
    if (mVar2 == 0) {
      pZip_local._4_4_ = 0;
    }
    else {
      sVar4 = strlen(pSrc_filename_local);
      if (sVar4 < 0x10000) {
        _ext_attributes =
             (anonymous_namespace)::miniz::mz_zip_writer_compute_padding_needed_for_file_alignment
                       ((mz_zip_archive *)pArchive_name_local);
        if ((*(int *)(pArchive_name_local + 0x10) == 0xffff) ||
           (0xffffffff <
            *(long *)pArchive_name_local + (ulong)_ext_attributes + 0x4c + (ulong)uncomp_crc32._2_2_
            + sVar4)) {
          pZip_local._4_4_ = 0;
        }
        else {
          mVar2 = (anonymous_namespace)::miniz::mz_zip_get_file_modified_time
                            ((char *)pComment_local,&local_70,
                             (mz_uint16 *)((long)&local_dir_header_ofs + 6));
          if (mVar2 == 0) {
            pZip_local._4_4_ = 0;
          }
          else {
            __stream = fopen64((char *)pComment_local,"rb");
            if (__stream == (FILE *)0x0) {
              pZip_local._4_4_ = 0;
            }
            else {
              fseeko64(__stream,0,2);
              uncomp_size_00 = (void *)ftello64(__stream);
              fseeko64(__stream,0,0);
              if (uncomp_size_00 < (void *)0x100000000) {
                if (uncomp_size_00 < (void *)0x4) {
                  _dos_time = 0;
                }
                mVar2 = (anonymous_namespace)::miniz::mz_zip_writer_write_zeros
                                  ((mz_zip_archive *)pArchive_name_local,cur_file_ofs,
                                   _ext_attributes + 0x1e);
                if (mVar2 == 0) {
                  fclose(__stream);
                  pZip_local._4_4_ = 0;
                }
                else {
                  uVar5 = _ext_attributes + mVar1;
                  if ((*(int *)(pArchive_name_local + 0x18) != 0) &&
                     ((uVar5 & *(int *)(pArchive_name_local + 0x18) - 1) != 0)) {
                    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                                  ,0x1864,
                                  "mz_bool (anonymous namespace)::miniz::mz_zip_writer_add_file(mz_zip_archive *, const char *, const char *, const void *, mz_uint16, mz_uint)"
                                 );
                  }
                  lVar6 = (ulong)_ext_attributes + 0x1e + cur_file_ofs;
                  memset(&pSrc_file,0,0x1e);
                  sVar7 = (**(code **)(pArchive_name_local + 0x48))
                                    (*(undefined8 *)(pArchive_name_local + 0x50),lVar6,
                                     pSrc_filename_local);
                  if (sVar7 == sVar4) {
                    uncomp_size = sVar4 + lVar6;
                    if (uncomp_size_00 != (void *)0x0) {
                      ptr = (mz_uint8 *)
                            (**(code **)(pArchive_name_local + 0x20))
                                      (*(undefined8 *)(pArchive_name_local + 0x38),1,0x10000);
                      if (ptr == (mz_uint8 *)0x0) {
                        fclose(__stream);
                        return 0;
                      }
                      pRead_buf = uncomp_size_00;
                      if (_dos_time == 0) {
                        for (; archive_name_size = (size_t)uncomp_size_00, pRead_buf != (void *)0x0;
                            pRead_buf = (void *)((long)pRead_buf - (ulong)state.m_comp_size._4_4_))
                        {
                          if (pRead_buf < (void *)0x10001) {
                            local_120 = pRead_buf;
                          }
                          else {
                            local_120 = (void *)0x10000;
                          }
                          state.m_comp_size._4_4_ = (uint)local_120;
                          sVar7 = fread(ptr,1,(ulong)local_120 & 0xffffffff,__stream);
                          if ((sVar7 != state.m_comp_size._4_4_) ||
                             (uVar8 = (**(code **)(pArchive_name_local + 0x48))
                                                (*(undefined8 *)(pArchive_name_local + 0x50),
                                                 uncomp_size,ptr,state.m_comp_size._4_4_),
                             uVar8 != state.m_comp_size._4_4_)) {
                            (**(code **)(pArchive_name_local + 0x28))
                                      (*(undefined8 *)(pArchive_name_local + 0x38),ptr);
                            fclose(__stream);
                            return 0;
                          }
                          mVar9 = mz_crc32((ulong)num_alignment_padding_bytes,ptr,
                                           (ulong)state.m_comp_size._4_4_);
                          num_alignment_padding_bytes = (mz_uint)mVar9;
                          uncomp_size = state.m_comp_size._4_4_ + uncomp_size;
                        }
                      }
                      else {
                        state.m_comp_size._0_4_ = 0;
                        d = (tdefl_compressor *)
                            (**(code **)(pArchive_name_local + 0x20))
                                      (*(undefined8 *)(pArchive_name_local + 0x38),1,0x4df78);
                        if (d == (tdefl_compressor *)0x0) {
                          (**(code **)(pArchive_name_local + 0x28))
                                    (*(undefined8 *)(pArchive_name_local + 0x38),ptr);
                          fclose(__stream);
                          return 0;
                        }
                        pComp = (tdefl_compressor *)pArchive_name_local;
                        state.m_cur_archive_file_ofs = 0;
                        state.m_pZip = (mz_zip_archive *)uncomp_size;
                        flags = tdefl_create_comp_flags_from_zip_params(_dos_time,-0xf,0);
                        tVar3 = tdefl_init(d,(anonymous_namespace)::miniz::
                                             mz_zip_writer_add_put_buf_callback,&pComp,flags);
                        if (tVar3 != TDEFL_STATUS_OKAY) {
                          (**(code **)(pArchive_name_local + 0x28))
                                    (*(undefined8 *)(pArchive_name_local + 0x38),d);
                          (**(code **)(pArchive_name_local + 0x28))
                                    (*(undefined8 *)(pArchive_name_local + 0x38),ptr);
                          fclose(__stream);
                          return 0;
                        }
                        do {
                          if (pRead_buf < (void *)0x10000) {
                            local_130 = pRead_buf;
                          }
                          else {
                            local_130 = (void *)0x10000;
                          }
                          uVar8 = (ulong)local_130 & 0xffffffff;
                          sVar7 = fread(ptr,1,uVar8,__stream);
                          if (sVar7 != uVar8) break;
                          mVar9 = mz_crc32((ulong)num_alignment_padding_bytes,ptr,uVar8);
                          num_alignment_padding_bytes = (mz_uint)mVar9;
                          pRead_buf = (void *)((long)pRead_buf - uVar8);
                          flush = TDEFL_FINISH;
                          if (pRead_buf != (void *)0x0) {
                            flush = TDEFL_NO_FLUSH;
                          }
                          tVar3 = tdefl_compress_buffer(d,ptr,uVar8,flush);
                          if (tVar3 == TDEFL_STATUS_DONE) {
                            state.m_comp_size._0_4_ = 1;
                            break;
                          }
                        } while (tVar3 == TDEFL_STATUS_OKAY);
                        (**(code **)(pArchive_name_local + 0x28))
                                  (*(undefined8 *)(pArchive_name_local + 0x38),d);
                        if ((int)state.m_comp_size == 0) {
                          (**(code **)(pArchive_name_local + 0x28))
                                    (*(undefined8 *)(pArchive_name_local + 0x38),ptr);
                          fclose(__stream);
                          return 0;
                        }
                        archive_name_size = state.m_cur_archive_file_ofs;
                        uncomp_size = (mz_uint64)state.m_pZip;
                        local_6e = 8;
                      }
                      (**(code **)(pArchive_name_local + 0x28))
                                (*(undefined8 *)(pArchive_name_local + 0x38),ptr);
                    }
                    fclose(__stream);
                    if ((archive_name_size < 0x100000000) && (uncomp_size < 0x100000000)) {
                      mVar2 = (anonymous_namespace)::miniz::mz_zip_writer_create_local_dir_header
                                        ((mz_zip_archive *)pArchive_name_local,
                                         (mz_uint8 *)&pSrc_file,(mz_uint16)sVar4,0,
                                         (mz_uint64)uncomp_size_00,archive_name_size,
                                         num_alignment_padding_bytes,local_6e,0,local_70,
                                         local_dir_header_ofs._6_2_);
                      if (mVar2 == 0) {
                        pZip_local._4_4_ = 0;
                      }
                      else {
                        lVar6 = (**(code **)(pArchive_name_local + 0x48))
                                          (*(undefined8 *)(pArchive_name_local + 0x50),uVar5,
                                           &pSrc_file,0x1e);
                        if (lVar6 == 0x1e) {
                          mVar2 = (anonymous_namespace)::miniz::mz_zip_writer_add_to_central_dir
                                            ((mz_zip_archive *)pArchive_name_local,
                                             pSrc_filename_local,(mz_uint16)sVar4,(void *)0x0,0,
                                             _level_and_flags_local,uncomp_crc32._2_2_,
                                             (mz_uint64)uncomp_size_00,archive_name_size,
                                             num_alignment_padding_bytes,local_6e,0,local_70,
                                             local_dir_header_ofs._6_2_,uVar5,
                                             (uint)local_dir_header_ofs._4_2_);
                          if (mVar2 == 0) {
                            pZip_local._4_4_ = 0;
                          }
                          else {
                            *(int *)(pArchive_name_local + 0x10) =
                                 *(int *)(pArchive_name_local + 0x10) + 1;
                            *(mz_uint64 *)pArchive_name_local = uncomp_size;
                            pZip_local._4_4_ = 1;
                          }
                        }
                        else {
                          pZip_local._4_4_ = 0;
                        }
                      }
                    }
                    else {
                      pZip_local._4_4_ = 0;
                    }
                  }
                  else {
                    fclose(__stream);
                    pZip_local._4_4_ = 0;
                  }
                }
              }
              else {
                fclose(__stream);
                pZip_local._4_4_ = 0;
              }
            }
          }
        }
      }
      else {
        pZip_local._4_4_ = 0;
      }
    }
  }
  else {
    pZip_local._4_4_ = 0;
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive *pZip, const char *pArchive_name,
                               const char *pSrc_filename, const void *pComment,
                               mz_uint16 comment_size,
                               mz_uint level_and_flags) {
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0, ext_attributes = 0;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size,
            cur_archive_file_ofs = pZip->m_archive_size, uncomp_size = 0,
            comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  MZ_FILE *pSrc_file = NULL;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) ||
      ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;
  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_get_file_modified_time(pSrc_filename, &dos_time, &dos_date))
    return MZ_FALSE;

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return MZ_FALSE;
  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  if (uncomp_size > 0xFFFFFFFF) {
    // No zip64 support yet
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  if (uncomp_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes +
                                     sizeof(local_dir_header))) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs +=
      num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                     archive_name_size) != archive_name_size) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (uncomp_size) {
    mz_uint64 uncomp_remaining = uncomp_size;
    void *pRead_buf =
        pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      MZ_FCLOSE(pSrc_file);
      return MZ_FALSE;
    }

    if (!level) {
      while (uncomp_remaining) {
        mz_uint n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
        if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) ||
            (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf,
                            n) != n)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          MZ_FCLOSE(pSrc_file);
          return MZ_FALSE;
        }
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
        uncomp_remaining -= n;
        cur_archive_file_ofs += n;
      }
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(
          pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                     tdefl_create_comp_flags_from_zip_params(
                         level, -15, MZ_DEFAULT_STRATEGY)) !=
          TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      for (;;) {
        size_t in_buf_size =
            (mz_uint32)MZ_MIN(uncomp_remaining, MZ_ZIP_MAX_IO_BUF_SIZE);
        tdefl_status status;

        if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
          break;

        uncomp_crc32 = (mz_uint32)mz_crc32(
            uncomp_crc32, (const mz_uint8 *)pRead_buf, in_buf_size);
        uncomp_remaining -= in_buf_size;

        status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size,
                                       uncomp_remaining ? TDEFL_NO_FLUSH
                                                        : TDEFL_FINISH);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY)
          break;
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;

      method = MZ_DEFLATED;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  MZ_FCLOSE(pSrc_file);
  pSrc_file = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(
          pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size,
          comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header,
                     sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment,
          comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0,
          dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}